

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall
CGraphics_Threaded::ReadBackbuffer
          (CGraphics_Threaded *this,uchar **ppPixels,int x,int y,int w,int h)

{
  long lVar1;
  undefined8 *in_RSI;
  CGraphics_Threaded *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  CScreenshotCommand Cmd;
  CImageInfo Image;
  uint in_stack_ffffffffffffff8c;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (undefined8 *)0x0) {
    mem_zero(in_RDI,in_stack_ffffffffffffff8c);
    CCommandBuffer::CScreenshotCommand::CScreenshotCommand((CScreenshotCommand *)0x1315cf);
    CCommandBuffer::AddCommand<CCommandBuffer::CScreenshotCommand>
              ((CCommandBuffer *)CONCAT44(in_R8D,in_R9D),(CScreenshotCommand *)in_RDI);
    KickCommandBuffer(in_RDI);
    (**(code **)(*(long *)in_RDI + 0x150))();
    *in_RSI = local_10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGraphics_Threaded::ReadBackbuffer(unsigned char **ppPixels, int x, int y, int w, int h)
{
	if(!ppPixels)
		return;

	// add swap command
	CImageInfo Image;
	mem_zero(&Image, sizeof(Image));

	CCommandBuffer::CScreenshotCommand Cmd;
	Cmd.m_pImage = &Image;
	Cmd.m_X = x; Cmd.m_Y = y;
	Cmd.m_W = w; Cmd.m_H = h;
	m_pCommandBuffer->AddCommand(Cmd);

	// kick the buffer and wait for the result
	KickCommandBuffer();
	WaitForIdle();

	*ppPixels = (unsigned char *)Image.m_pData; // take ownership!
}